

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ClosePendingUpvalues(ExpressionContext *ctx,FunctionData *function)

{
  ScopeData *pSVar1;
  uint uVar2;
  uint uVar3;
  FunctionData *pFVar4;
  VariableData **ppVVar5;
  SynBase *pSVar6;
  CloseUpvaluesData *local_d0;
  ExprBase *local_c8;
  VariableData *local_c0;
  VariableData *variable_4;
  SynBase *local_b0;
  VariableHandle *curr_1;
  VariableData *local_a0;
  VariableData *variable_3;
  ScopeData *pSStack_90;
  uint i_3;
  ScopeData *scope_2;
  VariableData *local_80;
  VariableData *variable_2;
  ScopeData *pSStack_70;
  uint i_2;
  ScopeData *scope_1;
  VariableData *local_60;
  VariableData *variable_1;
  ExprBase *pEStack_50;
  uint i_1;
  VariableData *local_48;
  VariableData *variable;
  ScopeData *pSStack_38;
  uint i;
  ScopeData *scope;
  CloseUpvaluesData *data;
  CloseUpvaluesData *curr;
  IntrusiveList<CloseUpvaluesData> *closeUpvalues;
  FunctionData *function_local;
  ExpressionContext *ctx_local;
  
  if (function == (FunctionData *)0x0) {
    local_d0 = (CloseUpvaluesData *)&ctx->globalCloseUpvalues;
  }
  else {
    local_d0 = (CloseUpvaluesData *)&function->closeUpvalues;
  }
  curr = local_d0;
  closeUpvalues = (IntrusiveList<CloseUpvaluesData> *)function;
  function_local = (FunctionData *)ctx;
  pFVar4 = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
  if (function != pFVar4) {
    __assert_fail("function == ctx.GetCurrentFunction(ctx.scope)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xb2b,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
  }
  data = (CloseUpvaluesData *)curr->expr;
  do {
    if (data == (CloseUpvaluesData *)0x0) {
      return;
    }
    scope = (ScopeData *)data;
    switch(data->type) {
    case CLOSE_UPVALUES_FUNCTION:
      if (closeUpvalues == (IntrusiveList<CloseUpvaluesData> *)0x0) {
        __assert_fail("function",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0xb34,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
      }
      for (pSStack_38 = data->scope; pSStack_38 != (ScopeData *)0x0; pSStack_38 = pSStack_38->scope)
      {
        for (variable._4_4_ = 0; uVar2 = variable._4_4_,
            uVar3 = SmallArray<VariableData_*,_4U>::size(&pSStack_38->variables), uVar2 < uVar3;
            variable._4_4_ = variable._4_4_ + 1) {
          ppVVar5 = SmallArray<VariableData_*,_4U>::operator[]
                              (&pSStack_38->variables,variable._4_4_);
          pFVar4 = function_local;
          local_48 = *ppVVar5;
          if ((local_48->usedAsExternal & 1U) != 0) {
            pSVar1 = scope->scope;
            pSVar6 = &ExpressionContext::MakeInternal
                                ((ExpressionContext *)function_local,
                                 (SynBase *)scope->ownerNamespace)->super_SynBase;
            pEStack_50 = CreateUpvalueClose((ExpressionContext *)pFVar4,pSVar6,local_48);
            SmallArray<ExprBase_*,_4U>::push_back
                      ((SmallArray<ExprBase_*,_4U> *)&pSVar1->contiueDepth,&stack0xffffffffffffffb0)
            ;
          }
        }
        if (pSStack_38->ownerFunction != (FunctionData *)0x0) break;
      }
      break;
    case CLOSE_UPVALUES_BLOCK:
      for (variable_1._4_4_ = 0; uVar2 = variable_1._4_4_,
          uVar3 = SmallArray<VariableData_*,_4U>::size
                            ((SmallArray<VariableData_*,_4U> *)
                             &(scope->ownerFunction->arguments).little[0].type), uVar2 < uVar3;
          variable_1._4_4_ = variable_1._4_4_ + 1) {
        ppVVar5 = SmallArray<VariableData_*,_4U>::operator[]
                            ((SmallArray<VariableData_*,_4U> *)
                             &(scope->ownerFunction->arguments).little[0].type,variable_1._4_4_);
        pFVar4 = function_local;
        local_60 = *ppVVar5;
        if ((local_60->usedAsExternal & 1U) != 0) {
          pSVar1 = scope->scope;
          pSVar6 = &ExpressionContext::MakeInternal
                              ((ExpressionContext *)function_local,(SynBase *)scope->ownerNamespace)
                    ->super_SynBase;
          scope_1 = (ScopeData *)CreateUpvalueClose((ExpressionContext *)pFVar4,pSVar6,local_60);
          SmallArray<ExprBase_*,_4U>::push_back
                    ((SmallArray<ExprBase_*,_4U> *)&pSVar1->contiueDepth,(ExprBase **)&scope_1);
        }
      }
      break;
    case CLOSE_UPVALUES_BREAK:
      for (pSStack_70 = data->scope;
          (pSStack_70 != (ScopeData *)0x0 &&
          (pSStack_70->breakDepth !=
           *(int *)((long)&scope->ownerFunction->type + 4) - *(int *)&scope->ownerType));
          pSStack_70 = pSStack_70->scope) {
        for (variable_2._4_4_ = 0; uVar2 = variable_2._4_4_,
            uVar3 = SmallArray<VariableData_*,_4U>::size(&pSStack_70->variables), uVar2 < uVar3;
            variable_2._4_4_ = variable_2._4_4_ + 1) {
          ppVVar5 = SmallArray<VariableData_*,_4U>::operator[]
                              (&pSStack_70->variables,variable_2._4_4_);
          pFVar4 = function_local;
          local_80 = *ppVVar5;
          if ((local_80->usedAsExternal & 1U) != 0) {
            pSVar1 = scope->scope;
            pSVar6 = &ExpressionContext::MakeInternal
                                ((ExpressionContext *)function_local,
                                 (SynBase *)scope->ownerNamespace)->super_SynBase;
            scope_2 = (ScopeData *)CreateUpvalueClose((ExpressionContext *)pFVar4,pSVar6,local_80);
            SmallArray<ExprBase_*,_4U>::push_back
                      ((SmallArray<ExprBase_*,_4U> *)&pSVar1->contiueDepth,(ExprBase **)&scope_2);
          }
        }
      }
      break;
    case CLOSE_UPVALUES_CONTINUE:
      for (pSStack_90 = data->scope;
          (pSStack_90 != (ScopeData *)0x0 &&
          (pSStack_90->contiueDepth !=
           *(int *)&scope->ownerFunction->contextType - *(int *)&scope->ownerType));
          pSStack_90 = pSStack_90->scope) {
        for (variable_3._4_4_ = 0; uVar2 = variable_3._4_4_,
            uVar3 = SmallArray<VariableData_*,_4U>::size(&pSStack_90->variables), uVar2 < uVar3;
            variable_3._4_4_ = variable_3._4_4_ + 1) {
          ppVVar5 = SmallArray<VariableData_*,_4U>::operator[]
                              (&pSStack_90->variables,variable_3._4_4_);
          pFVar4 = function_local;
          local_a0 = *ppVVar5;
          if ((local_a0->usedAsExternal & 1U) != 0) {
            pSVar1 = scope->scope;
            pSVar6 = &ExpressionContext::MakeInternal
                                ((ExpressionContext *)function_local,
                                 (SynBase *)scope->ownerNamespace)->super_SynBase;
            curr_1 = (VariableHandle *)
                     CreateUpvalueClose((ExpressionContext *)pFVar4,pSVar6,local_a0);
            SmallArray<ExprBase_*,_4U>::push_back
                      ((SmallArray<ExprBase_*,_4U> *)&pSVar1->contiueDepth,(ExprBase **)&curr_1);
          }
        }
      }
      break;
    case CLOSE_UPVALUES_ARGUMENT:
      if (closeUpvalues == (IntrusiveList<CloseUpvaluesData> *)0x0) {
        __assert_fail("function",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0xb6c,"void ClosePendingUpvalues(ExpressionContext &, FunctionData *)");
      }
      for (local_b0 = (SynBase *)closeUpvalues[0x1f].head; pFVar4 = function_local,
          local_b0 != (SynBase *)0x0; local_b0 = (SynBase *)local_b0->begin) {
        if ((*(byte *)(*(long *)&local_b0->typeID + 0x36) & 1) != 0) {
          pSVar1 = scope->scope;
          pSVar6 = &ExpressionContext::MakeInternal
                              ((ExpressionContext *)function_local,(SynBase *)scope->ownerNamespace)
                    ->super_SynBase;
          variable_4 = (VariableData *)
                       CreateUpvalueClose((ExpressionContext *)pFVar4,pSVar6,
                                          *(VariableData **)&local_b0->typeID);
          SmallArray<ExprBase_*,_4U>::push_back
                    ((SmallArray<ExprBase_*,_4U> *)&pSVar1->contiueDepth,(ExprBase **)&variable_4);
        }
      }
      local_c0 = (VariableData *)closeUpvalues[0x20].head;
      if ((local_c0 != (VariableData *)0x0) && ((local_c0->usedAsExternal & 1U) != 0)) {
        pSVar1 = scope->scope;
        pSVar6 = &ExpressionContext::MakeInternal
                            ((ExpressionContext *)function_local,(SynBase *)scope->ownerNamespace)->
                  super_SynBase;
        local_c8 = CreateUpvalueClose((ExpressionContext *)pFVar4,pSVar6,local_c0);
        SmallArray<ExprBase_*,_4U>::push_back
                  ((SmallArray<ExprBase_*,_4U> *)&pSVar1->contiueDepth,&local_c8);
      }
    }
    data = data->next;
  } while( true );
}

Assistant:

void ClosePendingUpvalues(ExpressionContext &ctx, FunctionData *function)
{
	IntrusiveList<CloseUpvaluesData> &closeUpvalues = function ? function->closeUpvalues : ctx.globalCloseUpvalues;

	assert(function == ctx.GetCurrentFunction(ctx.scope));

	for(CloseUpvaluesData *curr = closeUpvalues.head; curr; curr = curr->next)
	{
		CloseUpvaluesData &data = *curr;

		switch(data.type)
		{
		case CLOSE_UPVALUES_FUNCTION:
			assert(function);

			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}

				if(scope->ownerFunction)
					break;
			}
			break;
		case CLOSE_UPVALUES_BLOCK:
			for(unsigned i = 0; i < data.scope->variables.size(); i++)
			{
				VariableData *variable = data.scope->variables[i];

				if(variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
			}
			break;
		case CLOSE_UPVALUES_BREAK:
			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				if(scope->breakDepth == data.scope->breakDepth - data.depth)
					break;

				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}
			}
			break;
		case CLOSE_UPVALUES_CONTINUE:
			for(ScopeData *scope = data.scope; scope; scope = scope->scope)
			{
				if(scope->contiueDepth == data.scope->contiueDepth - data.depth)
					break;

				for(unsigned i = 0; i < scope->variables.size(); i++)
				{
					VariableData *variable = scope->variables[i];

					if(variable->usedAsExternal)
						data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
				}
			}
			break;
		case CLOSE_UPVALUES_ARGUMENT:
			assert(function);

			for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
			{
				if(curr->variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), curr->variable));
			}

			if(VariableData *variable = function->contextArgument)
			{
				if(variable->usedAsExternal)
					data.expr->expressions.push_back(CreateUpvalueClose(ctx, ctx.MakeInternal(data.source), variable));
			}
		}
	}
}